

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall JetHead::Socket::setConnected(Socket *this,bool state,int flags)

{
  int flags_local;
  bool state_local;
  Socket *this_local;
  
  if ((((bool)(this->mConnected & 1U) != state) &&
      (this->mConnected = state, this->mSelector != (Selector *)0x0)) &&
     (this->mListener != (SocketListener *)0x0)) {
    if ((this->mConnected & 1U) == 0) {
      Selector::removeListener(this->mSelector,this->mFd,&this->super_SelectorListener);
    }
    else {
      Selector::addListener(this->mSelector,this->mFd,(short)flags,&this->super_SelectorListener,0);
    }
  }
  return;
}

Assistant:

void Socket::setConnected( bool state, int flags )
{
	LOG_INFO( "Connected %d sel %p", state, mSelector );
	
	// if we are already in this state do nothing.
	if ( mConnected == state )
		return;
	
	mConnected = state;
	if ( mSelector != NULL and mListener != NULL )
	{
		if ( mConnected )
			mSelector->addListener( mFd, flags, this );
		else
			mSelector->removeListener( mFd, this );
	}
}